

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

void __thiscall qpdf::Tokenizer::inString(Tokenizer *this,char ch)

{
  int iVar1;
  char ch_local;
  Tokenizer *this_local;
  
  if (ch == '\n') {
    std::__cxx11::string::operator+=((string *)&this->val,'\n');
  }
  else if (ch == '\r') {
    std::__cxx11::string::operator+=((string *)&this->val,'\n');
    this->state = st_string_after_cr;
  }
  else if (ch == '(') {
    std::__cxx11::string::operator+=((string *)&this->val,'(');
    this->string_depth = this->string_depth + 1;
  }
  else if (ch == ')') {
    iVar1 = this->string_depth + -1;
    this->string_depth = iVar1;
    if (iVar1 == 0) {
      this->type = tt_string;
      this->state = st_token_ready;
    }
    else {
      std::__cxx11::string::operator+=((string *)&this->val,')');
    }
  }
  else if (ch == '\\') {
    this->state = st_string_escape;
  }
  else {
    std::__cxx11::string::operator+=((string *)&this->val,ch);
  }
  return;
}

Assistant:

void
Tokenizer::inString(char ch)
{
    switch (ch) {
    case '\\':
        state = st_string_escape;
        return;

    case '(':
        val += ch;
        ++string_depth;
        return;

    case ')':
        if (--string_depth == 0) {
            type = tt::tt_string;
            state = st_token_ready;
            return;
        }

        val += ch;
        return;

    case '\r':
        // CR by itself is converted to LF
        val += '\n';
        state = st_string_after_cr;
        return;

    case '\n':
        val += ch;
        return;

    default:
        val += ch;
        return;
    }
}